

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O1

void WebRtcNs_AnalyzeCore(NoiseSuppressionC *self,float *speechFrame)

{
  int iVar1;
  size_t sVar2;
  size_t i;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  size_t sVar7;
  int iVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  float energy;
  float fVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float magn [129];
  float noise [129];
  float snrLocPost [129];
  float imag [129];
  float snrLocPrior [129];
  float winData [256];
  float real [256];
  float local_12c0;
  float local_12a8;
  float local_1288 [132];
  float local_1078 [132];
  float afStack_e68 [132];
  float local_c58 [132];
  float afStack_a48 [132];
  float local_838 [256];
  float local_438 [258];
  
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x429,"void WebRtcNs_AnalyzeCore(NoiseSuppressionC *, const float *)");
  }
  iVar8 = self->modelUpdatePars[0];
  UpdateBuffer(speechFrame,self->blockLen,self->anaLen,self->analyzeBuf);
  sVar2 = self->anaLen;
  if (sVar2 == 0) {
    return;
  }
  pfVar6 = self->window;
  sVar7 = 0;
  do {
    local_838[sVar7] = pfVar6[sVar7] * self->analyzeBuf[sVar7];
    sVar7 = sVar7 + 1;
  } while (sVar2 != sVar7);
  fVar15 = 0.0;
  sVar7 = 0;
  do {
    fVar15 = fVar15 + local_838[sVar7] * local_838[sVar7];
    sVar7 = sVar7 + 1;
  } while (sVar2 != sVar7);
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    return;
  }
  self->blockInd = self->blockInd + 1;
  FFT(self,local_838,sVar2,self->magnLen,local_438,local_c58,local_1288);
  fVar15 = 0.0;
  uVar13 = self->magnLen;
  fVar25 = 0.0;
  local_12c0 = 0.0;
  local_12a8 = 0.0;
  fVar21 = 0.0;
  fVar24 = 0.0;
  if (uVar13 != 0) {
    uVar11 = 0;
    local_12a8 = 0.0;
    local_12c0 = 0.0;
    do {
      fVar22 = local_438[uVar11];
      fVar27 = local_c58[uVar11];
      fVar26 = local_1288[uVar11];
      if ((4 < uVar11) && (self->blockInd < 0x32)) {
        fVar16 = logf((float)uVar11);
        local_12c0 = local_12c0 + fVar16;
        local_12a8 = local_12a8 + fVar16 * fVar16;
        fVar17 = logf(fVar26);
        fVar21 = fVar21 + fVar17;
        fVar24 = fVar24 + fVar16 * fVar17;
      }
      fVar15 = fVar15 + fVar22 * fVar22 + fVar27 * fVar27;
      fVar25 = fVar25 + fVar26;
      uVar11 = uVar11 + 1;
      uVar13 = self->magnLen;
    } while (uVar11 < uVar13);
  }
  self->signalEnergy = fVar15 / (float)uVar13;
  self->sumMagn = fVar25;
  if (self->updates < 200) {
    self->updates = self->updates + 1;
  }
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      dVar18 = log((double)local_1288[uVar11]);
      afStack_e68[uVar11] = (float)dVar18;
      uVar11 = uVar11 + 1;
    } while (uVar11 < self->magnLen);
  }
  lVar3 = -4;
  lVar10 = 0;
  lVar12 = 0;
  do {
    sVar2 = self->magnLen;
    if (sVar2 != 0) {
      iVar1 = self->counter[lVar12];
      lVar4 = sVar2 * lVar10;
      sVar7 = 0;
      do {
        fVar22 = *(float *)((long)self->density + sVar7 * 4 + lVar4);
        fVar16 = (float)(~-(uint)(1.0 < fVar22) & 0x42200000 |
                        (uint)(40.0 / fVar22) & -(uint)(1.0 < fVar22));
        fVar27 = afStack_e68[sVar7];
        fVar26 = *(float *)((long)self->lquantile + sVar7 * 4 + lVar4 + 0x1248 + -0x1248);
        if (fVar27 <= fVar26) {
          fVar16 = fVar16 * -0.75;
        }
        else {
          fVar16 = fVar16 * 0.25;
        }
        fVar26 = fVar26 + fVar16 / (float)(iVar1 + 1);
        *(float *)((long)self->lquantile + sVar7 * 4 + lVar4 + 0x1248 + -0x1248) = fVar26;
        if (ABS(fVar27 - fVar26) < 0.01) {
          *(float *)((long)self->density + sVar7 * 4 + lVar4) =
               ((float)self->counter[lVar12] * fVar22 + 50.0) / (float)(self->counter[lVar12] + 1);
        }
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
    if (((199 < self->counter[lVar12]) && (self->counter[lVar12] = 0, sVar2 != 0)) &&
       (199 < self->updates)) {
      uVar11 = 0;
      do {
        dVar18 = exp((double)*(float *)((long)self->lquantile + uVar11 * 4 + sVar2 * lVar10));
        self->quantile[uVar11] = (float)dVar18;
        uVar11 = uVar11 + 1;
      } while (uVar11 < self->magnLen);
    }
    self->counter[lVar12] = self->counter[lVar12] + 1;
    lVar12 = lVar12 + 1;
    lVar3 = lVar3 + 4;
    lVar10 = lVar10 + 4;
  } while (lVar12 != 3);
  if ((self->updates < 200) && (self->magnLen != 0)) {
    uVar11 = 0;
    do {
      dVar18 = exp((double)*(float *)((long)self->lquantile + uVar11 * 4 + sVar2 * lVar3));
      self->quantile[uVar11] = (float)dVar18;
      uVar11 = uVar11 + 1;
    } while (uVar11 < self->magnLen);
  }
  uVar11 = self->magnLen;
  if (uVar11 != 0) {
    memcpy(local_1078,self->quantile,uVar11 * 4);
  }
  if (self->blockInd < 0x32) {
    self->whiteNoiseLevel = (fVar25 / (float)uVar11) * self->overdrive + self->whiteNoiseLevel;
    fVar22 = local_12a8 * (float)(uVar11 - 5) - local_12c0 * local_12c0;
    fVar27 = (local_12a8 * fVar21 - fVar24 * local_12c0) / fVar22;
    fVar25 = 0.0;
    if (0.0 <= fVar27) {
      fVar25 = fVar27;
    }
    fVar25 = fVar25 + self->pinkNoiseNumerator;
    self->pinkNoiseNumerator = fVar25;
    fVar22 = (local_12c0 * fVar21 - (float)(uVar11 - 5) * fVar24) / fVar22;
    fVar21 = 0.0;
    if (0.0 <= fVar22) {
      fVar21 = fVar22;
    }
    fVar24 = 1.0;
    if (fVar21 <= 1.0) {
      fVar24 = fVar21;
    }
    fVar24 = fVar24 + self->pinkNoiseExp;
    self->pinkNoiseExp = fVar24;
    fVar22 = 0.0;
    fVar21 = 0.0;
    if (0.0 < fVar24) {
      fVar21 = expf(fVar25 / (float)(self->blockInd + 1));
      fVar22 = (float)(self->blockInd + 1);
      fVar21 = fVar21 * fVar22;
      fVar22 = fVar24 / fVar22;
    }
    if (self->magnLen != 0) {
      uVar11 = 0;
      do {
        if ((self->pinkNoiseExp != 0.0) || (NAN(self->pinkNoiseExp))) {
          uVar5 = 5;
          if (5 < uVar11) {
            uVar5 = uVar11;
          }
          fVar24 = powf((float)uVar5,fVar22);
          fVar24 = fVar21 / fVar24;
        }
        else {
          fVar24 = self->whiteNoiseLevel;
        }
        self->parametricNoise[uVar11] = fVar24;
        iVar1 = self->blockInd;
        fVar24 = local_1078[uVar11];
        local_1078[uVar11] = (float)iVar1 * fVar24;
        local_1078[uVar11] =
             (((float)(0x32 - iVar1) * self->parametricNoise[uVar11]) / (float)(iVar1 + 1) +
             (float)iVar1 * fVar24) / 50.0;
        uVar11 = uVar11 + 1;
      } while (uVar11 < self->magnLen);
    }
  }
  iVar1 = self->blockInd;
  if (iVar1 < 200) {
    self->featureData[5] =
         (fVar15 / (float)uVar13 + (float)iVar1 * self->featureData[5]) / (float)(iVar1 + 1);
  }
  uVar13 = self->magnLen;
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      fVar15 = self->magnPrevAnalyze[uVar11];
      fVar21 = self->noisePrev[uVar11];
      fVar24 = self->smooth[uVar11];
      afStack_e68[uVar11] = 0.0;
      if (local_1078[uVar11] < local_1288[uVar11]) {
        afStack_e68[uVar11] = local_1288[uVar11] / (local_1078[uVar11] + 0.0001) + -1.0;
      }
      afStack_a48[uVar11] =
           (fVar15 / (fVar21 + 0.0001)) * fVar24 * 0.98 + afStack_e68[uVar11] * 0.01999998;
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  fVar15 = self->sumMagn;
  fVar21 = 0.0;
  if (1 < uVar13) {
    uVar11 = 1;
    do {
      if (local_1288[uVar11] <= 0.0) {
        self->featureData[0] = self->featureData[0] * -0.3 + self->featureData[0];
        goto LAB_00183a36;
      }
      dVar18 = log((double)local_1288[uVar11]);
      fVar21 = fVar21 + (float)dVar18;
      uVar11 = uVar11 + 1;
      uVar13 = self->magnLen;
    } while (uVar11 < uVar13);
  }
  dVar18 = exp((double)(fVar21 / (float)uVar13));
  self->featureData[0] =
       ((float)dVar18 / ((fVar15 - local_1288[0]) / (float)uVar13) - self->featureData[0]) * 0.3 +
       self->featureData[0];
LAB_00183a36:
  uVar13 = self->magnLen;
  fVar15 = 0.0;
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      fVar15 = fVar15 + self->magnAvgPause[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  fVar21 = (float)uVar13;
  if (uVar13 == 0) {
    fVar25 = 0.0;
    fVar22 = 0.0;
    fVar24 = 0.0;
  }
  else {
    fVar24 = 0.0;
    uVar11 = 0;
    fVar22 = 0.0;
    fVar25 = 0.0;
    do {
      fVar27 = local_1288[uVar11] - self->sumMagn / fVar21;
      fVar26 = self->magnAvgPause[uVar11] - fVar15 / fVar21;
      fVar25 = fVar25 + fVar27 * fVar26;
      fVar22 = fVar22 + fVar26 * fVar26;
      fVar24 = fVar24 + fVar27 * fVar27;
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  self->featureData[6] = self->signalEnergy + self->featureData[6];
  self->featureData[4] =
       ((fVar24 / fVar21 - ((fVar25 / fVar21) * (fVar25 / fVar21)) / (fVar22 / fVar21 + 0.0001)) /
        (self->featureData[5] + 0.0001) - self->featureData[4]) * 0.3 + self->featureData[4];
  if (0 < iVar8) {
    iVar1 = self->modelUpdatePars[3];
    self->modelUpdatePars[3] = iVar1 + -1;
    if (1 < iVar1) {
      FeatureParameterExtraction(self,0);
    }
    if (self->modelUpdatePars[3] == 0) {
      FeatureParameterExtraction(self,1);
      self->modelUpdatePars[3] = self->modelUpdatePars[1];
      if (iVar8 == 1) {
        self->modelUpdatePars[0] = 0;
      }
      else {
        self->featureData[5] =
             (self->featureData[6] / (float)self->modelUpdatePars[1] + self->featureData[5]) * 0.5;
        self->featureData[6] = 0.0;
      }
    }
  }
  fVar15 = self->priorModelPars[0];
  fVar21 = self->priorModelPars[1];
  fVar24 = self->priorModelPars[3];
  iVar8 = (int)self->priorModelPars[2];
  fVar25 = self->priorModelPars[4];
  fVar22 = self->priorModelPars[5];
  fVar27 = self->priorModelPars[6];
  uVar13 = self->magnLen;
  fVar16 = 0.0;
  fVar26 = 0.0;
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      fVar17 = afStack_a48[uVar11] + afStack_a48[uVar11];
      fVar23 = fVar17 + 1.0;
      fVar26 = afStack_e68[uVar11];
      dVar18 = log((double)fVar23);
      fVar26 = (((fVar26 + 1.0) * (fVar17 / (fVar23 + 0.0001)) - (float)dVar18) -
               self->logLrtTimeAvg[uVar11]) * 0.5 + self->logLrtTimeAvg[uVar11];
      self->logLrtTimeAvg[uVar11] = fVar26;
      fVar16 = fVar16 + fVar26;
      uVar11 = uVar11 + 1;
      uVar13 = self->magnLen;
      fVar26 = fVar16;
    } while (uVar11 < uVar13);
  }
  fVar26 = fVar26 / (float)uVar13;
  self->featureData[3] = fVar26;
  uVar14 = -(uint)(fVar26 < fVar15);
  dVar18 = tanh((double)((fVar26 - fVar15) * (float)(~uVar14 & 0x40800000 | uVar14 & 0x41000000)));
  fVar15 = self->featureData[0];
  if (iVar8 == 1) {
    fVar26 = (float)(~-(uint)(fVar21 < fVar15) & 0x40800000 | -(uint)(fVar21 < fVar15) & 0x41000000)
    ;
  }
  else {
    fVar26 = 4.0;
  }
  if (iVar8 == -1) {
    fVar26 = (float)(-(uint)(fVar15 < fVar21) & 0x41000000 |
                    ~-(uint)(fVar15 < fVar21) & (uint)fVar26);
  }
  dVar19 = tanh((double)((fVar21 - fVar15) * (float)iVar8 * fVar26));
  uVar14 = -(uint)(self->featureData[4] < fVar24);
  dVar20 = tanh((double)((self->featureData[4] - fVar24) *
                        (float)(~uVar14 & 0x40800000 | uVar14 & 0x41000000)));
  fVar21 = ((fVar25 * ((float)dVar18 + 1.0) * 0.5 + fVar22 * ((float)dVar19 + 1.0) * 0.5 +
            fVar27 * ((float)dVar20 + 1.0) * 0.5) - self->priorSpeechProb) * 0.1 +
           self->priorSpeechProb;
  fVar15 = 1.0;
  if (fVar21 <= 1.0) {
    fVar15 = fVar21;
  }
  fVar21 = 0.01;
  if (0.01 <= fVar15) {
    fVar21 = fVar15;
  }
  self->priorSpeechProb = fVar21;
  if (self->magnLen != 0) {
    uVar13 = 0;
    do {
      dVar18 = exp((double)-self->logLrtTimeAvg[uVar13]);
      self->speechProb[uVar13] = 1.0 / ((float)dVar18 * ((1.0 - fVar21) / (fVar21 + 0.0001)) + 1.0);
      uVar13 = uVar13 + 1;
    } while (uVar13 < self->magnLen);
  }
  sVar2 = self->magnLen;
  if (sVar2 != 0) {
    pfVar6 = local_1078;
    sVar7 = 0;
    fVar15 = 0.9;
    do {
      fVar21 = self->speechProb[sVar7];
      fVar24 = local_1288[sVar7];
      if (fVar21 < 0.2) {
        self->magnAvgPause[sVar7] =
             (fVar24 - self->magnAvgPause[sVar7]) * 0.05 + self->magnAvgPause[sVar7];
      }
      fVar24 = (1.0 - fVar21) * fVar24;
      fVar22 = self->noisePrev[sVar7] * fVar15 +
               (fVar21 * self->noisePrev[sVar7] + fVar24) * (1.0 - fVar15);
      fVar25 = *(float *)(&DAT_001ac9f0 + (ulong)(0.2 < fVar21) * 4);
      if ((fVar25 != fVar15) || (pfVar9 = pfVar6, NAN(fVar25) || NAN(fVar15))) {
        fVar15 = self->noisePrev[sVar7] * fVar25 +
                 (fVar24 + fVar21 * self->noisePrev[sVar7]) * (1.0 - fVar25);
        *pfVar6 = fVar15;
        if (fVar22 < fVar15) {
          pfVar9 = local_1078 + sVar7;
          goto LAB_00184059;
        }
      }
      else {
LAB_00184059:
        *pfVar9 = fVar22;
      }
      sVar7 = sVar7 + 1;
      pfVar6 = pfVar6 + 1;
      fVar15 = fVar25;
    } while (sVar2 != sVar7);
  }
  memcpy(self->noise,local_1078,sVar2 << 2);
  memcpy(self->magnPrevAnalyze,local_1288,sVar2 << 2);
  return;
}

Assistant:

void WebRtcNs_AnalyzeCore(NoiseSuppressionC* self, const float* speechFrame) {
  size_t i;
  const size_t kStartBand = 5;  // Skip first frequency bins during estimation.
  int updateParsFlag;
  float energy;
  float signalEnergy = 0.f;
  float sumMagn = 0.f;
  float tmpFloat1, tmpFloat2, tmpFloat3;
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL], noise[HALF_ANAL_BLOCKL];
  float snrLocPost[HALF_ANAL_BLOCKL], snrLocPrior[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];
  // Variables during startup.
  float sum_log_i = 0.0;
  float sum_log_i_square = 0.0;
  float sum_log_magn = 0.0;
  float sum_log_i_log_magn = 0.0;
  float parametric_exp = 0.0;
  float parametric_num = 0.0;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  updateParsFlag = self->modelUpdatePars[0];

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame, self->blockLen, self->anaLen, self->analyzeBuf);

  Windowing(self->window, self->analyzeBuf, self->anaLen, winData);
  energy = Energy(winData, self->anaLen);
  if (energy == 0.0) {
    // We want to avoid updating statistics in this case:
    // Updating feature statistics when we have zeros only will cause
    // thresholds to move towards zero signal situations. This in turn has the
    // effect that once the signal is "turned on" (non-zero values) everything
    // will be treated as speech and there is no noise suppression effect.
    // Depending on the duration of the inactive signal it takes a
    // considerable amount of time for the system to learn what is noise and
    // what is speech.
    return;
  }

  self->blockInd++;  // Update the block index only when we process a block.

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  for (i = 0; i < self->magnLen; i++) {
    signalEnergy += real[i] * real[i] + imag[i] * imag[i];
    sumMagn += magn[i];
    if (self->blockInd < END_STARTUP_SHORT) {
      if (i >= kStartBand) {
        tmpFloat2 = logf((float)i);
        sum_log_i += tmpFloat2;
        sum_log_i_square += tmpFloat2 * tmpFloat2;
        tmpFloat1 = logf(magn[i]);
        sum_log_magn += tmpFloat1;
        sum_log_i_log_magn += tmpFloat2 * tmpFloat1;
      }
    }
  }
  signalEnergy /= self->magnLen;
  self->signalEnergy = signalEnergy;
  self->sumMagn = sumMagn;

  // Quantile noise estimate.
  NoiseEstimation(self, magn, noise);
  // Compute simplified noise model during startup.
  if (self->blockInd < END_STARTUP_SHORT) {
    // Estimate White noise.
    self->whiteNoiseLevel += sumMagn / self->magnLen * self->overdrive;
    // Estimate Pink noise parameters.
    tmpFloat1 = sum_log_i_square * (self->magnLen - kStartBand);
    tmpFloat1 -= (sum_log_i * sum_log_i);
    tmpFloat2 =
        (sum_log_i_square * sum_log_magn - sum_log_i * sum_log_i_log_magn);
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the estimated spectrum to be positive.
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    self->pinkNoiseNumerator += tmpFloat3;
    tmpFloat2 = (sum_log_i * sum_log_magn);
    tmpFloat2 -= (self->magnLen - kStartBand) * sum_log_i_log_magn;
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the pink noise power to be in the interval [0, 1].
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    if (tmpFloat3 > 1.f) {
      tmpFloat3 = 1.f;
    }
    self->pinkNoiseExp += tmpFloat3;

    // Calculate frequency independent parts of parametric noise estimate.
    if (self->pinkNoiseExp > 0.f) {
      // Use pink noise estimate.
      parametric_num =
          expf(self->pinkNoiseNumerator / (float)(self->blockInd + 1));
      parametric_num *= (float)(self->blockInd + 1);
      parametric_exp = self->pinkNoiseExp / (float)(self->blockInd + 1);
    }
    for (i = 0; i < self->magnLen; i++) {
      // Estimate the background noise using the white and pink noise
      // parameters.
      if (self->pinkNoiseExp == 0.f) {
        // Use white noise estimate.
        self->parametricNoise[i] = self->whiteNoiseLevel;
      } else {
        // Use pink noise estimate.
        float use_band = (float)(i < kStartBand ? kStartBand : i);
        self->parametricNoise[i] =
            parametric_num / powf(use_band, parametric_exp);
      }
      // Weight quantile noise with modeled noise.
      noise[i] *= (self->blockInd);
      tmpFloat2 =
          self->parametricNoise[i] * (END_STARTUP_SHORT - self->blockInd);
      noise[i] += (tmpFloat2 / (float)(self->blockInd + 1));
      noise[i] /= END_STARTUP_SHORT;
    }
  }
  // Compute average signal during END_STARTUP_LONG time:
  // used to normalize spectral difference measure.
  if (self->blockInd < END_STARTUP_LONG) {
    self->featureData[5] *= self->blockInd;
    self->featureData[5] += signalEnergy;
    self->featureData[5] /= (self->blockInd + 1);
  }

  // Post and prior SNR needed for SpeechNoiseProb.
  ComputeSnr(self, magn, noise, snrLocPrior, snrLocPost);

  FeatureUpdate(self, magn, updateParsFlag);
  SpeechNoiseProb(self, self->speechProb, snrLocPrior, snrLocPost);
  UpdateNoiseEstimate(self, magn, snrLocPrior, snrLocPost, noise);

  // Keep track of noise spectrum for next frame.
  memcpy(self->noise, noise, sizeof(*noise) * self->magnLen);
  memcpy(self->magnPrevAnalyze, magn, sizeof(*magn) * self->magnLen);
}